

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.cpp
# Opt level: O3

void __thiscall
dg::pta::LLVMPointerGraphBuilder::addPHIOperands(LLVMPointerGraphBuilder *this,Function *F)

{
  iterator iVar1;
  Function *pFVar2;
  Function *pFVar3;
  Function *pFVar4;
  PHINode *local_38;
  
  pFVar3 = *(Function **)(F + 0x50);
  if (pFVar3 != F + 0x48) {
    do {
      pFVar2 = pFVar3 + -0x18;
      if (pFVar3 == (Function *)0x0) {
        pFVar2 = (Function *)0x0;
      }
      for (pFVar4 = *(Function **)(pFVar2 + 0x30); pFVar4 != pFVar2 + 0x28;
          pFVar4 = *(Function **)(pFVar4 + 8)) {
        if ((pFVar4 != (Function *)0x0) && (pFVar4[-8] == (Function)0x52)) {
          local_38 = (PHINode *)(pFVar4 + -0x18);
          iVar1 = std::
                  _Hashtable<const_llvm::Value_*,_std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_std::allocator<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::Value_*>,_std::hash<const_llvm::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find((_Hashtable<const_llvm::Value_*,_std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_std::allocator<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::Value_*>,_std::hash<const_llvm::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          *)(this + 0x188),(key_type *)&local_38);
          if ((PSNode *)
              **(undefined8 **)
                ((long)iVar1.
                       super__Node_iterator_base<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_false>
                       ._M_cur + 0x10) != (PSNode *)0x0) {
            addPHIOperands(this,(PSNode *)
                                **(undefined8 **)
                                  ((long)iVar1.
                                         super__Node_iterator_base<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_false>
                                         ._M_cur + 0x10),(PHINode *)(pFVar4 + -0x18));
          }
        }
      }
      pFVar3 = *(Function **)(pFVar3 + 8);
    } while (pFVar3 != F + 0x48);
  }
  return;
}

Assistant:

void LLVMPointerGraphBuilder::addPHIOperands(const llvm::Function &F) {
    for (const llvm::BasicBlock &B : F) {
        for (const llvm::Instruction &I : B) {
            if (const llvm::PHINode *PHI = llvm::dyn_cast<llvm::PHINode>(&I)) {
                if (PSNode *node = getNodes(PHI)->getSingleNode())
                    addPHIOperands(node, PHI);
            }
        }
    }
}